

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::releasePayload(Value *this)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  bool bVar1;
  ValueType VVar2;
  Value *this_local;
  
  VVar2 = type(this);
  if (realValue < VVar2) {
    if (VVar2 == stringValue) {
      bVar1 = isAllocated(this);
      if (bVar1) {
        releasePrefixedStringValue((this->value_).string_);
      }
    }
    else if (VVar2 != booleanValue) {
      if (1 < VVar2 - arrayValue) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                      ,0x401,"void Json::Value::releasePayload()");
      }
      this_00 = (this->value_).map_;
      if (this_00 !=
          (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x0) {
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::~map(this_00);
        operator_delete(this_00,0x30);
      }
    }
  }
  return;
}

Assistant:

void Value::releasePayload() {
  switch (type()) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (isAllocated())
      releasePrefixedStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}